

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O0

void NativeCodeData::AddFixupEntryForPointerArray(void *startAddress,DataChunk *chunkList)

{
  void *data;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  DataChunk *pDVar4;
  undefined4 *puVar5;
  DataChunk *pDVar6;
  HANDLE hHeap;
  NativeDataFixupEntry *pNVar7;
  NativeDataFixupEntry *entry;
  DataChunk *chunk1;
  bool foundTargetChunk;
  DataChunk *targetChunk;
  void *targetAddr;
  size_t offset;
  uint i;
  DataChunk *chunk;
  DataChunk *chunkList_local;
  void *startAddress_local;
  
  pDVar4 = GetDataChunk(startAddress);
  if ((pDVar4->len & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x61,"(chunk->len % sizeof(void*) == 0)","chunk->len % sizeof(void*) == 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  offset._4_4_ = 0;
  do {
    if (pDVar4->len >> 3 <= offset._4_4_) {
      return;
    }
    data = *(void **)((long)startAddress + (ulong)offset._4_4_ * 8);
    if (data != (void *)0x0) {
      pDVar6 = GetDataChunk(data);
      bVar3 = false;
      entry = (NativeDataFixupEntry *)chunkList;
      while( true ) {
        bVar2 = false;
        if (entry != (NativeDataFixupEntry *)0x0) {
          bVar2 = (bool)(bVar3 ^ 1);
        }
        if (!bVar2) break;
        bVar3 = (DataChunk *)entry == pDVar6;
        entry = *(NativeDataFixupEntry **)&entry[2].addrOffset;
      }
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                           ,0x76,"(foundTargetChunk)",
                           "current pointer is not allocated with NativeCodeData allocator?");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      hHeap = GetProcessHeap();
      pNVar7 = (NativeDataFixupEntry *)HeapAlloc(hHeap,0,0x10);
      if (pNVar7 == (NativeDataFixupEntry *)0x0) {
        Js::Throw::OutOfMemory();
      }
      pNVar7->addrOffset = (uint)((ulong)offset._4_4_ * 8);
      pNVar7->targetTotalOffset = pDVar6->offset;
      pNVar7->next = pDVar4->fixupList;
      pDVar4->fixupList = pNVar7;
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeCodeDataPhase);
      if (bVar3) {
        Output::Print(L"NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n",
                      startAddress,(ulong)offset._4_4_,(ulong)pNVar7->addrOffset,pDVar4,data,pDVar6,
                      pDVar4->dataType);
      }
    }
    offset._4_4_ = offset._4_4_ + 1;
  } while( true );
}

Assistant:

void
NativeCodeData::AddFixupEntryForPointerArray(void* startAddress, DataChunk * chunkList)
{
    DataChunk* chunk = NativeCodeData::GetDataChunk(startAddress);
    Assert(chunk->len % sizeof(void*) == 0);
    for (unsigned int i = 0; i < chunk->len / sizeof(void*); i++)
    {
        size_t offset = i * sizeof(void*);
        void* targetAddr = *(void**)((char*)startAddress + offset);

        if (targetAddr == nullptr)
        {
            continue;
        }

        DataChunk* targetChunk = NativeCodeData::GetDataChunk(targetAddr);

#if DBG
        bool foundTargetChunk = false;
        DataChunk* chunk1 = chunkList;
        while (chunk1 && !foundTargetChunk)
        {
            foundTargetChunk = (chunk1 == targetChunk);
            chunk1 = chunk1->next;
        }
        AssertMsg(foundTargetChunk, "current pointer is not allocated with NativeCodeData allocator?"); // change to valid check instead of assertion?
#endif

        NativeDataFixupEntry* entry = (NativeDataFixupEntry*)midl_user_allocate(sizeof(NativeDataFixupEntry));
        if (!entry)
        {
            Js::Throw::OutOfMemory();
        }
        __analysis_assume(entry);
        entry->addrOffset = (unsigned int)offset;
        entry->targetTotalOffset = targetChunk->offset;
        entry->next = chunk->fixupList;
        chunk->fixupList = entry;

#if DBG
        if (PHASE_TRACE1(Js::NativeCodeDataPhase))
        {
            Output::Print(_u("NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n"),
                startAddress, i, entry->addrOffset, (void*)chunk, targetAddr, (void*)targetChunk, chunk->dataType);
        }
#endif
    }
}